

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

bool tinyusdz::tydra::anon_unknown_6::TraverseRec<tinyusdz::PointInstancer>
               (string *path_prefix,Prim *prim,uint32_t depth,
               PathPrimMap<tinyusdz::PointInstancer> *itemmap)

{
  bool bVar1;
  Path *this;
  PointInstancer *pPVar2;
  mapped_type *ppPVar3;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *this_00;
  reference prim_00;
  Prim *child;
  const_iterator __end3;
  const_iterator __begin3;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *__range3;
  PointInstancer *pv;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [32];
  undefined1 local_50 [8];
  string prim_abs_path;
  PathPrimMap<tinyusdz::PointInstancer> *itemmap_local;
  uint32_t depth_local;
  Prim *prim_local;
  string *path_prefix_local;
  
  if (depth < 0x20001) {
    prim_abs_path.field_2._8_8_ = itemmap;
    ::std::operator+(local_70,(char *)path_prefix);
    this = Prim::local_path(prim);
    Path::full_path_name_abi_cxx11_((string *)&pv,this);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                     local_70);
    ::std::__cxx11::string::~string((string *)&pv);
    ::std::__cxx11::string::~string((string *)local_70);
    bVar1 = Prim::is<tinyusdz::PointInstancer>(prim);
    if ((bVar1) &&
       (pPVar2 = Prim::as<tinyusdz::PointInstancer>(prim), pPVar2 != (PointInstancer *)0x0)) {
      ppPVar3 = ::std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PointInstancer_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PointInstancer_*>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PointInstancer_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PointInstancer_*>_>_>
                              *)prim_abs_path.field_2._8_8_,(key_type *)local_50);
      *ppPVar3 = pPVar2;
    }
    this_00 = Prim::children(prim);
    __end3._M_current =
         (Prim *)std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::begin
                           ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)this_00);
    child = (Prim *)std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::end
                              ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
                                       *)&child), bVar1) {
      prim_00 = __gnu_cxx::
                __normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
                ::operator*(&__end3);
      bVar1 = TraverseRec<tinyusdz::PointInstancer>
                        ((string *)local_50,prim_00,depth + 1,
                         (PathPrimMap<tinyusdz::PointInstancer> *)prim_abs_path.field_2._8_8_);
      if (!bVar1) {
        path_prefix_local._7_1_ = false;
        goto LAB_0049ee9f;
      }
      __gnu_cxx::
      __normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
      ::operator++(&__end3);
    }
    path_prefix_local._7_1_ = true;
LAB_0049ee9f:
    ::std::__cxx11::string::~string((string *)local_50);
  }
  else {
    path_prefix_local._7_1_ = false;
  }
  return path_prefix_local._7_1_;
}

Assistant:

bool TraverseRec(const std::string &path_prefix, const tinyusdz::Prim &prim,
                 uint32_t depth, PathPrimMap<T> &itemmap) {
  if (depth > 1024 * 128) {
    // Too deep
    return false;
  }

  std::string prim_abs_path =
      path_prefix + "/" + prim.local_path().full_path_name();

  if (prim.is<T>()) {
    if (const T *pv = prim.as<T>()) {
      DCOUT("Path : <" << prim_abs_path << "> is " << tinyusdz::value::TypeTraits<T>::type_name());
      itemmap[prim_abs_path] = pv;
    }
  }

  for (const auto &child : prim.children()) {
    if (!TraverseRec(prim_abs_path, child, depth + 1, itemmap)) {
      return false;
    }
  }

  return true;
}